

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

Vector3f pbrt::SampleUniformHemisphere(Point2f *u)

{
  Tuple3<pbrt::Vector3,_float> TVar1;
  Tuple2<pbrt::Point2,_float> *in_RDI;
  float fVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  Float phi;
  Float r;
  Float z;
  float in_stack_ffffffffffffffb8;
  float x;
  undefined8 local_c;
  undefined4 local_4;
  
  fVar2 = Tuple2<pbrt::Point2,_float>::operator[](in_RDI,0);
  vfnmadd213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),SUB6416(ZEXT464(0x3f800000),0));
  fVar3 = SafeSqrt(0.0);
  fVar4 = Tuple2<pbrt::Point2,_float>::operator[](in_RDI,1);
  x = fVar3;
  dVar5 = std::cos((double)(ulong)(uint)(fVar4 * 6.2831855));
  fVar2 = x * SUB84(dVar5,0);
  std::sin((double)(ulong)(uint)(fVar4 * 6.2831855));
  Vector3<float>::Vector3((Vector3<float> *)CONCAT44(fVar2,fVar3),x,in_stack_ffffffffffffffb8,0.0);
  TVar1.z = local_4;
  TVar1._0_8_ = local_c;
  return (Vector3f)TVar1;
}

Assistant:

PBRT_CPU_GPU
inline Vector3f SampleUniformHemisphere(const Point2f &u) {
    Float z = u[0];
    Float r = SafeSqrt(1 - z * z);
    Float phi = 2 * Pi * u[1];
    return {r * std::cos(phi), r * std::sin(phi), z};
}